

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

void sobelFilter(Mat *image)

{
  int iVar1;
  _OutputArray local_308;
  _InputArray local_2f0;
  _InputArray local_2d8;
  Mat local_2c0 [8];
  Mat out;
  _OutputArray local_260;
  _InputArray local_248;
  Mat local_230 [8];
  Mat abs_grad_y;
  _OutputArray local_1d0;
  _InputArray local_1b8;
  Mat local_1a0 [8];
  Mat grad_y;
  _OutputArray local_140;
  _InputArray local_128;
  Mat local_110 [8];
  Mat abs_grad_x;
  _OutputArray local_b0;
  _InputArray local_88;
  Mat local_70 [8];
  Mat grad_x;
  Mat *image_local;
  
  cv::Mat::Mat(local_70);
  cv::_InputArray::_InputArray(&local_88,image);
  cv::_OutputArray::_OutputArray(&local_b0,local_70);
  iVar1 = cv::Mat::depth(image);
  cv::Sobel(&local_88,&local_b0,iVar1,1,0,3,1.0,0.0,4);
  cv::_OutputArray::~_OutputArray(&local_b0);
  cv::_InputArray::~_InputArray(&local_88);
  cv::Mat::Mat(local_110);
  cv::_InputArray::_InputArray(&local_128,local_70);
  cv::_OutputArray::_OutputArray(&local_140,local_110);
  cv::convertScaleAbs(&local_128,&local_140,1.0,0.0);
  cv::_OutputArray::~_OutputArray(&local_140);
  cv::_InputArray::~_InputArray(&local_128);
  cv::Mat::Mat(local_1a0);
  cv::_InputArray::_InputArray(&local_1b8,image);
  cv::_OutputArray::_OutputArray(&local_1d0,local_1a0);
  iVar1 = cv::Mat::depth(image);
  cv::Sobel(&local_1b8,&local_1d0,iVar1,0,1,3,1.0,0.0,4);
  cv::_OutputArray::~_OutputArray(&local_1d0);
  cv::_InputArray::~_InputArray(&local_1b8);
  cv::Mat::Mat(local_230);
  cv::_InputArray::_InputArray(&local_248,local_1a0);
  cv::_OutputArray::_OutputArray(&local_260,local_230);
  cv::convertScaleAbs(&local_248,&local_260,1.0,0.0);
  cv::_OutputArray::~_OutputArray(&local_260);
  cv::_InputArray::~_InputArray(&local_248);
  cv::Mat::Mat(local_2c0);
  cv::_InputArray::_InputArray(&local_2d8,local_110);
  cv::_InputArray::_InputArray(&local_2f0,local_230);
  cv::_OutputArray::_OutputArray(&local_308,local_2c0);
  cv::addWeighted(&local_2d8,0.5,&local_2f0,0.5,0.0,&local_308,-1);
  cv::_OutputArray::~_OutputArray(&local_308);
  cv::_InputArray::~_InputArray(&local_2f0);
  cv::_InputArray::~_InputArray(&local_2d8);
  cv::Mat::operator=(image,local_2c0);
  cv::Mat::~Mat(local_2c0);
  cv::Mat::~Mat(local_230);
  cv::Mat::~Mat(local_1a0);
  cv::Mat::~Mat(local_110);
  cv::Mat::~Mat(local_70);
  return;
}

Assistant:

void sobelFilter(cv::Mat & image) {
	cv::Mat grad_x;
	cv::Sobel(image, grad_x, image.depth(), 1, 0);
	cv::Mat abs_grad_x;
	cv::convertScaleAbs(grad_x, abs_grad_x);

	cv::Mat grad_y;
	cv::Sobel(image, grad_y, image.depth(), 0, 1);
	cv::Mat abs_grad_y;
	cv::convertScaleAbs(grad_y, abs_grad_y);

	cv::Mat out;
	cv::addWeighted(abs_grad_x, 0.5, abs_grad_y, 0.5, 0, out);

	image = out;
}